

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  bool bVar3;
  Test *this_00;
  OsStackTraceGetterInterface *pOVar4;
  undefined **ppuVar5;
  long lVar6;
  long lVar7;
  timeval now;
  timeval local_40;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar2 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[8])(pTVar1);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    lVar6 = local_40.tv_sec * 1000;
    lVar7 = local_40.tv_usec / 1000;
    if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar5 = &PTR__OsStackTraceGetterInterface_00146648;
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_00146648;
      pUVar2->os_stack_trace_getter_ = pOVar4;
    }
    else {
      ppuVar5 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar5)[3])();
    this_00 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar3 = Test::HasFatalFailure();
    if (!bVar3) {
      bVar3 = Test::IsSkipped();
      if (!bVar3) {
        Test::Run(this_00);
      }
    }
    lVar7 = lVar7 + lVar6;
    if (this_00 != (Test *)0x0) {
      if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
        pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
        ppuVar5 = &PTR__OsStackTraceGetterInterface_00146648;
        pOVar4->_vptr_OsStackTraceGetterInterface =
             (_func_int **)&PTR__OsStackTraceGetterInterface_00146648;
        pUVar2->os_stack_trace_getter_ = pOVar4;
      }
      else {
        ppuVar5 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
      }
      (*((_func_int **)ppuVar5)[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (this_00,0x12a58a,(char *)0x0);
    }
    (this->result_).start_timestamp_ = lVar7;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    (this->result_).elapsed_time_ = (local_40.tv_sec * 1000 - lVar7) + local_40.tv_usec / 1000;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    pUVar2->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_start_timestamp(start);
  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(nullptr);
}